

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::SpirVSource::~SpirVSource(SpirVSource *this)

{
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__SpirVSource_00127738;
  std::__cxx11::string::~string((string *)&this->source);
  return;
}

Assistant:

~SpirVSource		(void) {}